

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O2

void anon_unknown.dwarf_188c2::verifyLevelsAreEqual
               (DeepImageLevel *level1,DeepImageLevel *level2,int dx,int dy)

{
  float *pfVar1;
  float *pfVar2;
  uint *puVar3;
  uint *puVar4;
  uint uVar5;
  undefined8 *puVar6;
  long lVar7;
  DeepImageChannel *pDVar8;
  DeepImageChannel *pDVar9;
  ImageLevel *pIVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  const_iterator cVar14;
  ConstIterator CVar15;
  ostream *poVar16;
  TypedDeepImageChannel<float> *this;
  TypedDeepImageChannel<float> *this_00;
  DeepImageLevel *pDVar17;
  DeepImageLevel *pDVar18;
  uint *puVar19;
  float *pfVar20;
  float *pfVar21;
  TypedDeepImageChannel<unsigned_int> *this_01;
  TypedDeepImageChannel<unsigned_int> *this_02;
  uint *puVar22;
  ArgExc *this_03;
  ulong uVar23;
  char *pcVar24;
  const_iterator local_80;
  
  if (((((level1->super_ImageLevel)._dataWindow.min.x ==
         (level2->super_ImageLevel)._dataWindow.min.x - dx) &&
       ((level1->super_ImageLevel)._dataWindow.min.y ==
        (level2->super_ImageLevel)._dataWindow.min.y - dy)) &&
      ((level1->super_ImageLevel)._dataWindow.max.x ==
       (level2->super_ImageLevel)._dataWindow.max.x - dx)) &&
     ((level1->super_ImageLevel)._dataWindow.max.y ==
      (level2->super_ImageLevel)._dataWindow.max.y - dy)) {
    cVar14._M_node = (_Base_ptr)Imf_2_5::DeepImageLevel::begin(level1);
    for (local_80._M_node = (_Base_ptr)Imf_2_5::DeepImageLevel::begin(level2);
        (CVar15 = Imf_2_5::DeepImageLevel::end(level1),
        (const_iterator)cVar14._M_node != CVar15._i._M_node &&
        (CVar15 = Imf_2_5::DeepImageLevel::end(level2),
        (const_iterator)local_80._M_node != CVar15._i._M_node));
        local_80._M_node = (_Base_ptr)std::_Rb_tree_increment(local_80._M_node)) {
      poVar16 = std::operator<<((ostream *)&std::cout,"            channel ");
      poVar16 = std::operator<<(poVar16,(string *)(cVar14._M_node + 1));
      std::endl<char,std::char_traits<char>>(poVar16);
      bVar11 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (cVar14._M_node + 1),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_80._M_node + 1));
      if (bVar11) {
        this_03 = (ArgExc *)__cxa_allocate_exception(0x48);
        pcVar24 = "different channel names";
        goto LAB_00112ba1;
      }
      iVar12 = (**(code **)**(undefined8 **)(cVar14._M_node + 2))();
      iVar13 = (**(code **)**(undefined8 **)(local_80._M_node + 2))();
      if (iVar12 != iVar13) {
LAB_00112be7:
        this_03 = (ArgExc *)__cxa_allocate_exception(0x48);
        pcVar24 = "different channel types";
        goto LAB_00112ba1;
      }
      puVar6 = *(undefined8 **)(cVar14._M_node + 2);
      lVar7 = *(long *)(local_80._M_node + 2);
      if ((*(int *)(puVar6 + 2) != *(int *)(lVar7 + 0x10)) ||
         (*(int *)((long)puVar6 + 0x14) != *(int *)(lVar7 + 0x14))) {
        this_03 = (ArgExc *)__cxa_allocate_exception(0x48);
        pcVar24 = "different channel sampling rates";
        goto LAB_00112ba1;
      }
      if (*(char *)(puVar6 + 3) != *(char *)(lVar7 + 0x18)) goto LAB_00112be7;
      iVar12 = (**(code **)*puVar6)();
      if (iVar12 == 0) {
        pDVar8 = *(DeepImageChannel **)(cVar14._M_node + 2);
        pDVar9 = *(DeepImageChannel **)(local_80._M_node + 2);
        this_01 = (TypedDeepImageChannel<unsigned_int> *)
                  __dynamic_cast(pDVar8,&Imf_2_5::DeepImageChannel::typeinfo,
                                 &Imf_2_5::TypedDeepImageChannel<unsigned_int>::typeinfo,0);
        if ((this_01 == (TypedDeepImageChannel<unsigned_int> *)0x0) ||
           (this_02 = (TypedDeepImageChannel<unsigned_int> *)
                      __dynamic_cast(pDVar9,&Imf_2_5::DeepImageChannel::typeinfo,
                                     &Imf_2_5::TypedDeepImageChannel<unsigned_int>::typeinfo,0),
           this_02 == (TypedDeepImageChannel<unsigned_int> *)0x0)) {
LAB_00112bfb:
          __cxa_bad_cast();
        }
        pIVar10 = (pDVar8->super_ImageChannel)._level;
        pDVar17 = Imf_2_5::DeepImageChannel::deepLevel(pDVar8);
        pDVar18 = Imf_2_5::DeepImageChannel::deepLevel(pDVar9);
        for (iVar12 = (pIVar10->_dataWindow).min.y; iVar12 <= (pIVar10->_dataWindow).max.y;
            iVar12 = iVar12 + 1) {
          for (iVar13 = (pIVar10->_dataWindow).min.x; iVar13 <= (pIVar10->_dataWindow).max.x;
              iVar13 = iVar13 + 1) {
            puVar19 = Imf_2_5::SampleCountChannel::at(&pDVar17->_sampleCounts,iVar13,iVar12);
            uVar5 = *puVar19;
            puVar19 = Imf_2_5::SampleCountChannel::at
                                (&pDVar18->_sampleCounts,iVar13 + dx,iVar12 + dy);
            if (uVar5 != *puVar19) goto LAB_00112bbf;
            puVar19 = Imf_2_5::TypedDeepImageChannel<unsigned_int>::at(this_01,iVar13,iVar12);
            puVar22 = Imf_2_5::TypedDeepImageChannel<unsigned_int>::at
                                (this_02,iVar13 + dx,iVar12 + dy);
            if ((int)uVar5 < 1) {
              uVar5 = 0;
            }
            uVar23 = 0;
            while (uVar5 != uVar23) {
              puVar3 = puVar19 + uVar23;
              puVar4 = puVar22 + uVar23;
              uVar23 = uVar23 + 1;
              if (*puVar3 != *puVar4) goto LAB_00112b8f;
            }
          }
        }
      }
      else if (iVar12 == 2) {
        pDVar8 = *(DeepImageChannel **)(cVar14._M_node + 2);
        pDVar9 = *(DeepImageChannel **)(local_80._M_node + 2);
        this = (TypedDeepImageChannel<float> *)
               __dynamic_cast(pDVar8,&Imf_2_5::DeepImageChannel::typeinfo,
                              &Imf_2_5::TypedDeepImageChannel<float>::typeinfo,0);
        if ((this == (TypedDeepImageChannel<float> *)0x0) ||
           (this_00 = (TypedDeepImageChannel<float> *)
                      __dynamic_cast(pDVar9,&Imf_2_5::DeepImageChannel::typeinfo,
                                     &Imf_2_5::TypedDeepImageChannel<float>::typeinfo,0),
           this_00 == (TypedDeepImageChannel<float> *)0x0)) goto LAB_00112bfb;
        pIVar10 = (pDVar8->super_ImageChannel)._level;
        pDVar17 = Imf_2_5::DeepImageChannel::deepLevel(pDVar8);
        pDVar18 = Imf_2_5::DeepImageChannel::deepLevel(pDVar9);
        for (iVar12 = (pIVar10->_dataWindow).min.y; iVar12 <= (pIVar10->_dataWindow).max.y;
            iVar12 = iVar12 + 1) {
          for (iVar13 = (pIVar10->_dataWindow).min.x; iVar13 <= (pIVar10->_dataWindow).max.x;
              iVar13 = iVar13 + 1) {
            puVar19 = Imf_2_5::SampleCountChannel::at(&pDVar17->_sampleCounts,iVar13,iVar12);
            uVar5 = *puVar19;
            puVar19 = Imf_2_5::SampleCountChannel::at
                                (&pDVar18->_sampleCounts,iVar13 + dx,iVar12 + dy);
            if (uVar5 != *puVar19) goto LAB_00112bbf;
            pfVar20 = Imf_2_5::TypedDeepImageChannel<float>::at(this,iVar13,iVar12);
            pfVar21 = Imf_2_5::TypedDeepImageChannel<float>::at(this_00,iVar13 + dx,iVar12 + dy);
            if ((int)uVar5 < 1) {
              uVar5 = 0;
            }
            uVar23 = 0;
            while (uVar5 != uVar23) {
              pfVar1 = pfVar20 + uVar23;
              pfVar2 = pfVar21 + uVar23;
              uVar23 = uVar23 + 1;
              if ((*pfVar1 != *pfVar2) || (NAN(*pfVar1) || NAN(*pfVar2))) goto LAB_00112b8f;
            }
          }
        }
      }
      else {
        if (iVar12 != 1) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfUtilTest/testDeepImage.cpp"
                        ,0x9b,
                        "void (anonymous namespace)::verifyLevelsAreEqual(const DeepImageLevel &, const DeepImageLevel &, int, int)"
                       );
        }
        verifyPixelsAreEqual<half>
                  (*(DeepImageChannel **)(cVar14._M_node + 2),
                   *(DeepImageChannel **)(local_80._M_node + 2),dx,dy);
      }
      cVar14._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar14._M_node);
    }
    CVar15 = Imf_2_5::DeepImageLevel::end(level1);
    if (((const_iterator)cVar14._M_node == CVar15._i._M_node) &&
       (CVar15 = Imf_2_5::DeepImageLevel::end(level2),
       (const_iterator)local_80._M_node == CVar15._i._M_node)) {
      return;
    }
    this_03 = (ArgExc *)__cxa_allocate_exception(0x48);
    pcVar24 = "different channel lists";
  }
  else {
    this_03 = (ArgExc *)__cxa_allocate_exception(0x48);
    pcVar24 = "different data windows";
  }
LAB_00112ba1:
  Iex_2_5::ArgExc::ArgExc(this_03,pcVar24);
  __cxa_throw(this_03,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
LAB_00112bbf:
  this_03 = (ArgExc *)__cxa_allocate_exception(0x48);
  pcVar24 = "different pixel sample counts";
  goto LAB_00112ba1;
LAB_00112b8f:
  this_03 = (ArgExc *)__cxa_allocate_exception(0x48);
  pcVar24 = "different sample values";
  goto LAB_00112ba1;
}

Assistant:

void
verifyLevelsAreEqual
    (const DeepImageLevel &level1,
     const DeepImageLevel &level2,
     int dx,
     int dy)
{
    if (level1.dataWindow().min.x != level2.dataWindow().min.x - dx ||
        level1.dataWindow().min.y != level2.dataWindow().min.y - dy ||
        level1.dataWindow().max.x != level2.dataWindow().max.x - dx ||
        level1.dataWindow().max.y != level2.dataWindow().max.y - dy)
    {
        throw ArgExc ("different data windows");
    }

    DeepImageLevel::ConstIterator i1 = level1.begin();
    DeepImageLevel::ConstIterator i2 = level2.begin();

    while (i1 != level1.end() && i2 != level2.end())
    {
        cout << "            channel " << i1.name() << endl;

        if (i1.name() != i2.name())
            throw ArgExc ("different channel names");

        if (i1.channel().pixelType() != i2.channel().pixelType())
            throw ArgExc ("different channel types");

        if (i1.channel().xSampling() != i2.channel().xSampling() ||
            i1.channel().ySampling() != i2.channel().ySampling())
            throw ArgExc ("different channel sampling rates");

        if (i1.channel().pLinear() != i2.channel().pLinear())
            throw ArgExc ("different channel types");

        switch (i1.channel().pixelType())
        {
          case HALF:

            verifyPixelsAreEqual <half>
                (i1.channel(), i2.channel(), dx, dy);

            break;

          case FLOAT:

            verifyPixelsAreEqual <float>
                (i1.channel(), i2.channel(), dx, dy);

            break;

          case UINT:

            verifyPixelsAreEqual <unsigned int>
                (i1.channel(), i2.channel(), dx, dy);

            break;

          default:
             assert (false);
        }

        ++i1;
        ++i2;
    }

    if (i1 != level1.end() || i2 != level2.end())
        throw ArgExc ("different channel lists");
}